

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O1

uint64_t highwayhash::(anonymous_namespace)::RunHighwayCat<2u>(void *param_1,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  int iVar5;
  uint64_t *packet_1;
  long *plVar6;
  __m128i *buffer;
  ulong uVar7;
  ulong uVar8;
  V128<unsigned_long> t;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar16;
  ulong uVar15;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined4 uVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  V128<unsigned_long> t_2;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  long lVar27;
  undefined1 auVar26 [16];
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  V128<unsigned_long> t_1;
  undefined1 auVar36 [16];
  ulong uVar37;
  undefined1 auVar38 [16];
  ulong uVar39;
  ulong uVar40;
  HighwayHashCatT<2U> cat;
  HHPacket tmp;
  char in [1024];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  Intrinsic local_620;
  undefined1 local_610 [16];
  long local_600;
  long lStack_5f8;
  long local_5f0;
  long lStack_5e8;
  ulong local_5e0;
  ulong uStack_5d8;
  ulong local_5d0;
  ulong uStack_5c8;
  ulong local_5c0;
  ulong uStack_5b8;
  ulong local_5b0;
  ulong uStack_5a8;
  size_t local_5a0;
  HHStateSSE41 local_580;
  undefined1 local_500 [16];
  ulong local_4f0;
  ulong uStack_4e8;
  ulong local_4e0;
  ulong uStack_4d8;
  ulong local_4d0;
  ulong uStack_4c8;
  ulong local_4c0;
  ulong uStack_4b8;
  long local_4b0;
  long lStack_4a8;
  long local_4a0;
  long lStack_498;
  Intrinsic local_490;
  long local_480 [138];
  
  local_620 = _DAT_001123b0;
  local_610 = _DAT_001123c0;
  lVar30 = 0x3bd39e10cb0ef593;
  lVar33 = -0x3f530e974a0e7574;
  local_600 = 0x3bd39e10cb0ef593;
  lStack_5f8 = -0x3f530e974a0e7574;
  lVar25 = -0x41ab9932cb16f394;
  lVar27 = 0x452821e538d01377;
  local_5f0 = -0x41ab9932cb16f394;
  lStack_5e8 = 0x452821e538d01377;
  uVar7 = 0xdbe6d5d5fe4cce2f;
  uVar15 = 0xa4093822299f31d0;
  local_5e0 = 0xdbe6d5d5fe4cce2f;
  uStack_5d8 = 0xa4093822299f31d0;
  uVar17 = 0x13198a2e03707344;
  uVar28 = 0x243f6a8885a308d3;
  local_5d0 = 0x13198a2e03707344;
  uStack_5c8 = 0x243f6a8885a308d3;
  uVar31 = 0x3bd39e10cb0ef593;
  uVar34 = 0xc0acf169b5f18a8c;
  local_5c0 = 0x3bd39e10cb0ef593;
  uStack_5b8 = 0xc0acf169b5f18a8c;
  uVar35 = 0xbe5466cf34e90c6c;
  uVar37 = 0x452821e638d01377;
  local_5b0 = 0xbe5466cf34e90c6c;
  uStack_5a8 = 0x452821e638d01377;
  local_5a0 = 0;
  local_640 = (undefined1  [16])0x0;
  local_630 = (undefined1  [16])0x0;
  local_480[0]._0_1_ = (char)size;
  uVar8 = size >> 1;
  if (size < 0x40) {
    if (1 < size) {
      memcpy(local_640,local_480,uVar8);
    }
    local_5a0 = local_5a0 + uVar8;
  }
  else {
    plVar6 = local_480;
    local_5a0 = uVar8;
    do {
      auVar38._0_8_ = lVar30 + uVar7 + *plVar6;
      auVar38._8_8_ = lVar33 + uVar15 + plVar6[1];
      auVar36._0_8_ = lVar25 + uVar17 + plVar6[2];
      auVar36._8_8_ = lVar27 + uVar28 + plVar6[3];
      uVar16 = local_620[0]._4_4_;
      auVar9._4_4_ = uVar16;
      auVar9._0_4_ = uVar16;
      auVar9._8_4_ = local_620[1]._4_4_;
      auVar9._12_4_ = local_620[1]._4_4_;
      uVar7 = (ulong)uVar16 * (auVar38._0_8_ & 0xffffffff) ^ uVar7;
      uVar15 = (auVar9._8_8_ & 0xffffffff) * (auVar38._8_8_ & 0xffffffff) ^ uVar15;
      uVar29 = uVar35 + local_610._0_8_;
      uVar32 = uVar37 + local_610._8_8_;
      uVar17 = (local_610._0_8_ >> 0x20) * (auVar36._0_8_ & 0xffffffff) ^ uVar17;
      uVar28 = (local_610._8_8_ >> 0x20) * (auVar36._8_8_ & 0xffffffff) ^ uVar28;
      uVar39 = local_620[0] + uVar31;
      uVar40 = local_620[1] + uVar34;
      uVar16 = (uint)(auVar38._0_8_ >> 0x20);
      uVar21 = (undefined4)(auVar38._8_8_ >> 0x20);
      auVar22._4_4_ = uVar16;
      auVar22._0_4_ = uVar16;
      auVar22._8_4_ = uVar21;
      auVar22._12_4_ = uVar21;
      uVar31 = (ulong)uVar16 * (uVar39 & 0xffffffff) ^ uVar31;
      uVar34 = (auVar22._8_8_ & 0xffffffff) * (uVar40 & 0xffffffff) ^ uVar34;
      auVar9 = pshufb(auVar36,_DAT_00112230);
      local_610._0_8_ = auVar9._0_8_ + uVar29;
      local_610._8_8_ = auVar9._8_8_ + uVar32;
      auVar9 = pshufb(local_610,_DAT_00112230);
      lVar25 = auVar9._0_8_ + auVar36._0_8_;
      lVar27 = auVar9._8_8_ + auVar36._8_8_;
      uVar35 = (auVar36._0_8_ >> 0x20) * (uVar29 & 0xffffffff) ^ uVar35;
      uVar37 = (auVar36._8_8_ >> 0x20) * (uVar32 & 0xffffffff) ^ uVar37;
      auVar9 = pshufb(auVar38,_DAT_00112230);
      local_620[0] = auVar9._0_8_ + uVar39;
      local_620[1] = auVar9._8_8_ + uVar40;
      auVar9 = pshufb((undefined1  [16])local_620,_DAT_00112230);
      lVar30 = auVar9._0_8_ + auVar38._0_8_;
      lVar33 = auVar9._8_8_ + auVar38._8_8_;
      plVar6 = plVar6 + 4;
      local_5a0 = local_5a0 - 0x20;
    } while (0x1f < local_5a0);
    local_600 = lVar30;
    lStack_5f8 = lVar33;
    local_5f0 = lVar25;
    lStack_5e8 = lVar27;
    local_5e0 = uVar7;
    uStack_5d8 = uVar15;
    local_5d0 = uVar17;
    uStack_5c8 = uVar28;
    local_5c0 = uVar31;
    uStack_5b8 = uVar34;
    local_5b0 = uVar35;
    uStack_5a8 = uVar37;
    if (local_5a0 != 0) {
      memcpy(local_640,plVar6,local_5a0);
    }
  }
  sVar4 = local_5a0;
  plVar6 = (long *)((long)local_480 + uVar8);
  uVar8 = size - uVar8;
  uVar7 = 0x20 - local_5a0;
  if (uVar8 < uVar7) {
    if (uVar8 != 0) {
      memcpy(local_640 + local_5a0,plVar6,uVar8);
    }
    local_5a0 = local_5a0 + uVar8;
  }
  else {
    if (local_5a0 != 0) {
      local_500 = local_610;
      local_4f0 = local_5e0;
      uStack_4e8 = uStack_5d8;
      local_4e0 = local_5d0;
      uStack_4d8 = uStack_5c8;
      local_4d0 = local_5c0;
      uStack_4c8 = uStack_5b8;
      local_4c0 = local_5b0;
      uStack_4b8 = uStack_5a8;
      local_4b0 = local_5f0;
      lStack_4a8 = lStack_5e8;
      local_4a0 = local_600;
      lStack_498 = lStack_5f8;
      local_490[0] = local_620[0];
      local_490[1] = local_620[1];
      memcpy(&local_580,local_640,local_5a0);
      if (sVar4 != 0x20) {
        memcpy((void *)((long)local_580.v0L.v_ + sVar4),plVar6,uVar7);
      }
      auVar18._0_8_ = local_4a0 + local_4f0 + local_580.v0L.v_[0];
      auVar18._8_8_ = lStack_498 + uStack_4e8 + local_580.v0L.v_[1];
      auVar23._0_8_ =
           local_4b0 + local_4e0 +
           CONCAT44(local_580.v0H.v_[0]._4_4_,(undefined4)local_580.v0H.v_[0]);
      auVar23._8_8_ =
           lStack_4a8 + uStack_4d8 +
           CONCAT44(local_580.v0H.v_[1]._4_4_,(undefined4)local_580.v0H.v_[1]);
      uVar16 = local_490[0]._4_4_;
      auVar10._4_4_ = uVar16;
      auVar10._0_4_ = uVar16;
      auVar10._8_4_ = local_490[1]._4_4_;
      auVar10._12_4_ = local_490[1]._4_4_;
      local_5e0 = local_4f0 ^ (ulong)uVar16 * (auVar18._0_8_ & 0xffffffff);
      uStack_5d8 = uStack_4e8 ^ (auVar10._8_8_ & 0xffffffff) * (auVar18._8_8_ & 0xffffffff);
      local_5d0 = local_4e0 ^ ((ulong)local_500._0_8_ >> 0x20) * (auVar23._0_8_ & 0xffffffff);
      uStack_5c8 = uStack_4d8 ^ ((ulong)local_500._8_8_ >> 0x20) * (auVar23._8_8_ & 0xffffffff);
      uVar15 = local_490[0] + local_4d0;
      uVar17 = local_490[1] + uStack_4c8;
      uVar16 = (uint)(auVar18._0_8_ >> 0x20);
      uVar21 = (undefined4)(auVar18._8_8_ >> 0x20);
      auVar12._4_4_ = uVar16;
      auVar12._0_4_ = uVar16;
      auVar12._8_4_ = uVar21;
      auVar12._12_4_ = uVar21;
      local_5c0 = local_4d0 ^ (ulong)uVar16 * (uVar15 & 0xffffffff);
      uStack_5b8 = uStack_4c8 ^ (auVar12._8_8_ & 0xffffffff) * (uVar17 & 0xffffffff);
      local_5b0 = local_4c0 ^ (auVar23._0_8_ >> 0x20) * (local_4c0 + local_500._0_8_ & 0xffffffff);
      uStack_5a8 = uStack_4b8 ^
                   (auVar23._8_8_ >> 0x20) * (uStack_4b8 + local_500._8_8_ & 0xffffffff);
      auVar9 = pshufb(auVar18,_DAT_00112230);
      local_620[0] = uVar15 + auVar9._0_8_;
      local_620[1] = uVar17 + auVar9._8_8_;
      auVar9 = pshufb(auVar23,_DAT_00112230);
      local_610._0_8_ = auVar9._0_8_ + local_4c0 + local_500._0_8_;
      local_610._8_8_ = auVar9._8_8_ + uStack_4b8 + local_500._8_8_;
      auVar9 = pshufb((undefined1  [16])local_620,_DAT_00112230);
      local_600 = auVar18._0_8_ + auVar9._0_8_;
      lStack_5f8 = auVar18._8_8_ + auVar9._8_8_;
      auVar9 = pshufb(local_610,_DAT_00112230);
      local_5f0 = auVar23._0_8_ + auVar9._0_8_;
      lStack_5e8 = auVar23._8_8_ + auVar9._8_8_;
      plVar6 = (long *)((long)plVar6 + uVar7);
      uVar8 = uVar8 - uVar7;
    }
    while (local_5a0 = uVar8, 0x1f < local_5a0) {
      auVar19._0_8_ = local_600 + local_5e0 + *plVar6;
      auVar19._8_8_ = lStack_5f8 + uStack_5d8 + plVar6[1];
      auVar24._0_8_ = local_5f0 + local_5d0 + plVar6[2];
      auVar24._8_8_ = lStack_5e8 + uStack_5c8 + plVar6[3];
      uVar16 = local_620[0]._4_4_;
      auVar13._4_4_ = uVar16;
      auVar13._0_4_ = uVar16;
      auVar13._8_4_ = local_620[1]._4_4_;
      auVar13._12_4_ = local_620[1]._4_4_;
      local_5e0 = local_5e0 ^ (ulong)uVar16 * (auVar19._0_8_ & 0xffffffff);
      uStack_5d8 = uStack_5d8 ^ (auVar13._8_8_ & 0xffffffff) * (auVar19._8_8_ & 0xffffffff);
      uVar8 = local_5b0 + local_610._0_8_;
      uVar7 = uStack_5a8 + local_610._8_8_;
      local_5d0 = local_5d0 ^ (local_610._0_8_ >> 0x20) * (auVar24._0_8_ & 0xffffffff);
      uStack_5c8 = uStack_5c8 ^ (local_610._8_8_ >> 0x20) * (auVar24._8_8_ & 0xffffffff);
      uVar15 = local_620[0] + local_5c0;
      uVar17 = local_620[1] + uStack_5b8;
      uVar16 = (uint)(auVar19._0_8_ >> 0x20);
      uVar21 = (undefined4)(auVar19._8_8_ >> 0x20);
      auVar14._4_4_ = uVar16;
      auVar14._0_4_ = uVar16;
      auVar14._8_4_ = uVar21;
      auVar14._12_4_ = uVar21;
      local_5c0 = local_5c0 ^ (ulong)uVar16 * (uVar15 & 0xffffffff);
      uStack_5b8 = uStack_5b8 ^ (auVar14._8_8_ & 0xffffffff) * (uVar17 & 0xffffffff);
      local_5b0 = local_5b0 ^ (auVar24._0_8_ >> 0x20) * (uVar8 & 0xffffffff);
      uStack_5a8 = uStack_5a8 ^ (auVar24._8_8_ >> 0x20) * (uVar7 & 0xffffffff);
      auVar9 = pshufb(auVar19,_DAT_00112230);
      local_620[0] = uVar15 + auVar9._0_8_;
      local_620[1] = uVar17 + auVar9._8_8_;
      auVar9 = pshufb(auVar24,_DAT_00112230);
      local_610._0_8_ = auVar9._0_8_ + uVar8;
      local_610._8_8_ = auVar9._8_8_ + uVar7;
      auVar9 = pshufb((undefined1  [16])local_620,_DAT_00112230);
      local_600 = auVar19._0_8_ + auVar9._0_8_;
      lStack_5f8 = auVar19._8_8_ + auVar9._8_8_;
      auVar9 = pshufb(local_610,_DAT_00112230);
      local_5f0 = auVar24._0_8_ + auVar9._0_8_;
      lStack_5e8 = auVar24._8_8_ + auVar9._8_8_;
      plVar6 = plVar6 + 4;
      uVar8 = local_5a0 - 0x20;
    }
    if (local_5a0 != 0) {
      memcpy(local_640,plVar6,local_5a0);
    }
  }
  local_580.v0L.v_[0] = local_620[0];
  local_580.v0L.v_[1] = local_620[1];
  local_580.v0H.v_[0]._0_4_ = local_610._0_4_;
  local_580.v0H.v_[0]._4_4_ = local_610._4_4_;
  local_580.v0H.v_[1]._0_4_ = local_610._8_4_;
  local_580.v0H.v_[1]._4_4_ = local_610._12_4_;
  local_580.v1L.v_[0]._0_4_ = (undefined4)local_600;
  local_580.v1L.v_[0]._4_4_ = (uint)((ulong)local_600 >> 0x20);
  local_580.v1L.v_[1] = lStack_5f8;
  local_580.v1H.v_[0] = local_5f0;
  local_580.v1H.v_[1] = lStack_5e8;
  local_580.mul0L.v_[0] = local_5e0;
  local_580.mul0L.v_[1] = uStack_5d8;
  local_580.mul0H.v_[0] = local_5d0;
  local_580.mul0H.v_[1] = uStack_5c8;
  local_580.mul1L.v_[0] = local_5c0;
  local_580.mul1L.v_[1] = uStack_5b8;
  local_580.mul1H.v_[0] = local_5b0;
  local_580.mul1H.v_[1] = uStack_5a8;
  if (local_5a0 != 0) {
    SSE41::HHStateSSE41::UpdateRemainder(&local_580,local_640,local_5a0);
  }
  lVar27 = CONCAT44(local_580.v1L.v_[0]._4_4_,(undefined4)local_580.v1L.v_[0]);
  uVar8 = CONCAT44(local_580.v0H.v_[1]._4_4_,(undefined4)local_580.v0H.v_[1]);
  lVar25 = CONCAT44(local_580.v0H.v_[0]._4_4_,(undefined4)local_580.v0H.v_[0]);
  iVar5 = 4;
  do {
    local_580.v0H.v_[1]._0_4_ = (undefined4)uVar8;
    local_580.v0H.v_[0]._4_4_ = (uint)((ulong)lVar25 >> 0x20);
    local_580.v0H.v_[0]._0_4_ = (undefined4)lVar25;
    auVar11._0_8_ = CONCAT44((undefined4)local_580.v0L.v_[0],local_580.v0L.v_[0]._4_4_);
    auVar11._8_4_ = local_580.v0L.v_[1]._4_4_;
    auVar11._12_4_ = (undefined4)local_580.v0L.v_[1];
    auVar26._0_8_ = CONCAT44((undefined4)local_580.v0H.v_[0],local_580.v0H.v_[0]._4_4_);
    auVar26._8_4_ = local_580.v0H.v_[0]._4_4_;
    auVar26._12_4_ = (undefined4)local_580.v0H.v_[1];
    uVar17 = auVar26._0_8_ + lVar27 + local_580.mul0L.v_[0];
    uVar28 = auVar26._8_8_ + local_580.v1L.v_[1] + local_580.mul0L.v_[1];
    local_580.v1L.v_[0]._4_4_ = (uint)(uVar17 >> 0x20);
    uVar7 = local_580.v1H.v_[0] + auVar11._0_8_ + local_580.mul0H.v_[0];
    uVar15 = local_580.v1H.v_[1] + auVar11._8_8_ + local_580.mul0H.v_[1];
    local_580.mul0L.v_[0] =
         (ulong)local_580.v0L.v_[0]._4_4_ * (uVar17 & 0xffffffff) ^ local_580.mul0L.v_[0];
    local_580.mul0L.v_[1] =
         (auVar11._8_8_ & 0xffffffff) * (uVar28 & 0xffffffff) ^ local_580.mul0L.v_[1];
    local_580.mul0H.v_[0] =
         local_580.mul0H.v_[0] ^ (ulong)local_580.v0H.v_[0]._4_4_ * (uVar7 & 0xffffffff);
    local_580.mul0H.v_[1] = local_580.mul0H.v_[1] ^ (uVar8 >> 0x20) * (uVar15 & 0xffffffff);
    uVar35 = local_580.v0L.v_[0] + local_580.mul1L.v_[0];
    uVar37 = local_580.v0L.v_[1] + local_580.mul1L.v_[1];
    auVar20._4_4_ = local_580.v1L.v_[0]._4_4_;
    auVar20._0_4_ = local_580.v1L.v_[0]._4_4_;
    auVar20._8_4_ = local_580.v1L.v_[0]._4_4_;
    auVar20._12_4_ = local_580.v1L.v_[0]._4_4_;
    uVar31 = lVar25 + local_580.mul1H.v_[0];
    uVar34 = uVar8 + local_580.mul1H.v_[1];
    local_580.mul1L.v_[0] =
         (ulong)local_580.v1L.v_[0]._4_4_ * (uVar35 & 0xffffffff) ^ local_580.mul1L.v_[0];
    local_580.mul1L.v_[1] =
         (auVar20._8_8_ & 0xffffffff) * (uVar37 & 0xffffffff) ^ local_580.mul1L.v_[1];
    auVar2._8_8_ = uVar28;
    auVar2._0_8_ = uVar17;
    auVar9 = pshufb(auVar2,_DAT_00112230);
    local_580.v0L.v_[0] = auVar9._0_8_ + uVar35;
    local_580.v0L.v_[1] = auVar9._8_8_ + uVar37;
    auVar3._8_8_ = uVar15;
    auVar3._0_8_ = uVar7;
    auVar9 = pshufb(auVar3,_DAT_00112230);
    lVar25 = auVar9._0_8_ + uVar31;
    uVar8 = auVar9._8_8_ + uVar34;
    local_580.v0H.v_[1]._0_4_ = (undefined4)uVar8;
    local_580.v0H.v_[1]._4_4_ = (undefined4)(uVar8 >> 0x20);
    auVar9 = pshufb((undefined1  [16])local_580.v0L.v_,_DAT_00112230);
    lVar27 = auVar9._0_8_ + uVar17;
    local_580.v1L.v_[1] = auVar9._8_8_ + uVar28;
    auVar1._8_4_ = (undefined4)local_580.v0H.v_[1];
    auVar1._0_8_ = lVar25;
    auVar1._12_4_ = local_580.v0H.v_[1]._4_4_;
    auVar9 = pshufb(auVar1,_DAT_00112230);
    local_580.v1H.v_[0] = auVar9._0_8_ + uVar7;
    local_580.v1H.v_[1] = auVar9._8_8_ + uVar15;
    local_580.mul1H.v_[0] = local_580.mul1H.v_[0] ^ (uVar7 >> 0x20) * (uVar31 & 0xffffffff);
    local_580.mul1H.v_[1] = local_580.mul1H.v_[1] ^ (uVar15 >> 0x20) * (uVar34 & 0xffffffff);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return local_580.mul1L.v_[0] + lVar27 + local_580.v0L.v_[0] + local_580.mul0L.v_[0];
}

Assistant:

uint64_t RunHighwayCat(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  HH_ALIGNAS(64) HighwayHashCatT<Target> cat(key);
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  const size_t half_size = size / 2;
  cat.Append(in, half_size);
  cat.Append(in + half_size, size - half_size);
  HHResult64 result;
  cat.Finalize(&result);
  return result;
}